

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O1

ASN1_OBJECT * OBJ_nid2obj(int n)

{
  ASN1_OBJECT *pAVar1;
  ASN1_OBJECT *pAVar2;
  ASN1_OBJECT templ;
  undefined1 local_30 [16];
  int local_20;
  
  if (n == 0) {
    pAVar2 = &OBJ_get_undef::kUndef;
  }
  else {
    if ((uint)n < 0x3c6) {
      if (kObjects[n - 1U].nid != 0) {
        return (ASN1_OBJECT *)(kObjects + (n - 1U));
      }
    }
    else {
      CRYPTO_MUTEX_lock_read(&global_added_lock);
      if ((global_added_by_nid != (lhash_st_ASN1_OBJECT *)0x0) &&
         (local_20 = n,
         pAVar1 = (ASN1_OBJECT *)
                  OPENSSL_lh_retrieve((_LHASH *)global_added_by_nid,local_30,
                                      lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func),
         pAVar1 != (ASN1_OBJECT *)0x0)) {
        CRYPTO_MUTEX_unlock_read(&global_added_lock);
        return pAVar1;
      }
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
    }
    pAVar2 = (ASN1_OBJECT *)0x0;
    ERR_put_error(8,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                  ,0x143);
  }
  return (ASN1_OBJECT *)pAVar2;
}

Assistant:

ASN1_OBJECT *OBJ_nid2obj(int nid) {
  if (nid == NID_undef) {
    return (ASN1_OBJECT *)OBJ_get_undef();
  }

  if (nid > 0 && nid < NUM_NID) {
    const ASN1_OBJECT *obj = get_builtin_object(nid);
    if (nid != NID_undef && obj->nid == NID_undef) {
      goto err;
    }
    return (ASN1_OBJECT *)obj;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_nid != NULL) {
    ASN1_OBJECT *match, templ;

    templ.nid = nid;
    match = lh_ASN1_OBJECT_retrieve(global_added_by_nid, &templ);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

err:
  OPENSSL_PUT_ERROR(OBJ, OBJ_R_UNKNOWN_NID);
  return NULL;
}